

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall EventNotValid::~EventNotValid(EventNotValid *this)

{
  EventError::~EventError(&this->super_EventError);
  operator_delete(this);
  return;
}

Assistant:

EventNotValid(std::string reason) : EventError(reason){

    }